

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctor.hpp
# Opt level: O2

void __thiscall
njoy::ENDFtk::section::Type<4>::MixedDistributions::MixedDistributions
          (MixedDistributions *this,LegendreDistributions *legendre,
          TabulatedDistributions *tabulated)

{
  InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>::
  InterpolationSequenceRecord
            ((InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::LegendreCoefficients> *)
             this,(InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>
                   *)legendre);
  InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>::
  InterpolationSequenceRecord
            ((InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution> *)
             &this->tabulated_,
             (InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution> *)
             tabulated);
  verifyBoundary((*(pointer *)
                   ((long)&(this->legendre_).
                           super_AngularDistributions<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>
                           .
                           super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>
                           .sequence_.
                           super__Vector_base<njoy::ENDFtk::section::Type<4>::LegendreCoefficients,_std::allocator<njoy::ENDFtk::section::Type<4>::LegendreCoefficients>_>
                           ._M_impl.super__Vector_impl_data + 8))[-1].super_ListRecord.metadata.
                 fields.super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                 super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                 super__Head_base<1UL,_double,_false>._M_head_impl,
                 ((_Head_base<1UL,_double,_false> *)
                 ((long)&(((this->tabulated_).
                           super_AngularDistributions<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>
                           .
                           super_InterpolationSequenceRecord<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>
                           .sequence_.
                           super__Vector_base<njoy::ENDFtk::section::Type<4>::TabulatedDistribution,_std::allocator<njoy::ENDFtk::section::Type<4>::TabulatedDistribution>_>
                           ._M_impl.super__Vector_impl_data._M_start)->super_TabulationRecord).
                         super_InterpolationBase.metadata + 0x20))->_M_head_impl);
  return;
}

Assistant:

MixedDistributions( LegendreDistributions&& legendre,
                    TabulatedDistributions&& tabulated ) :
  legendre_( std::move( legendre ) ), tabulated_( std::move( tabulated ) ) {

    verifyBoundary(
      this->legendre_.angularDistributions().back().incidentEnergy(),
      this->tabulated_.angularDistributions().front().incidentEnergy() );
  }